

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_statemachine(Curl_easy *data,connectdata *conn)

{
  anon_union_280_9_4527acc7_for_proto *pp;
  byte *pbVar1;
  ushort *puVar2;
  IMAP *pIVar3;
  curl_trc_feat *pcVar4;
  bool bVar5;
  uint uVar6;
  dynbuf *s;
  _Bool _Var7;
  unsigned_short uVar8;
  CURLcode CVar9;
  int iVar10;
  CURLofft CVar11;
  CURLcode CVar12;
  char *pcVar13;
  ulong uVar14;
  void *pvVar15;
  char *pcVar16;
  byte *pbVar17;
  connectdata *pcVar18;
  size_t sVar19;
  int imapcode;
  curl_off_t size;
  size_t nread;
  uint local_74;
  dynbuf local_70;
  dynbuf *local_50;
  SASL *local_48;
  size_t local_40;
  char *local_38;
  
  local_40 = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    CVar9 = imap_perform_upgrade_tls(data,conn);
    return CVar9;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar9 = Curl_pp_flushsend(data,&(pp->ftpc).pp);
    return CVar9;
  }
  local_50 = (dynbuf *)((long)&conn->proto + 0x60);
  local_48 = &(conn->proto).imapc.sasl;
  do {
    CVar9 = Curl_pp_readresp(data,0,&(pp->ftpc).pp,(int *)&local_74,&local_40);
    uVar6 = local_74;
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    if (local_74 == 0xffffffff) {
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if (local_74 == 0) {
      return CURLE_OK;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      pcVar18 = data->conn;
      if (local_74 != 1) {
        if (local_74 != 3) {
          Curl_failf(data,"Got unexpected imap-server response");
          CVar9 = CURLE_WEIRD_SERVER_REPLY;
          break;
        }
        pbVar17 = (byte *)((long)&pcVar18->proto + 0xfb);
        *pbVar17 = *pbVar17 | 2;
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) {
          Curl_infof(data,"PREAUTH connection, already authenticated");
        }
      }
      *(undefined2 *)((long)&pcVar18->proto + 0xb8) = 0;
      *(undefined2 *)((long)&pcVar18->proto + 0xbc) = 0;
      pbVar17 = (byte *)((long)&pcVar18->proto + 0xfb);
      *pbVar17 = *pbVar17 & 0xfb;
      CVar9 = imap_sendf(data,"CAPABILITY");
      if (CVar9 == CURLE_OK) {
        (data->conn->proto).imapc.state = IMAP_CAPABILITY;
      }
      break;
    case IMAP_CAPABILITY:
      pcVar18 = data->conn;
      pcVar13 = Curl_dyn_ptr(&(pcVar18->proto).ftpc.pp.recvbuf);
      if (uVar6 != 0x2a) {
        if (((data->set).use_ssl != '\0') && (_Var7 = Curl_conn_is_ssl(pcVar18,0), !_Var7)) {
          if ((uVar6 == 1) && ((*(byte *)((long)&pcVar18->proto + 0xfb) & 6) == 4)) {
            CVar9 = imap_sendf(data,"STARTTLS");
            if (CVar9 == CURLE_OK) {
              (data->conn->proto).imapc.state = IMAP_STARTTLS;
            }
            break;
          }
          if (1 < (data->set).use_ssl) {
            pcVar13 = "STARTTLS not available.";
            goto LAB_0013d97c;
          }
        }
LAB_0013d92e:
        CVar9 = imap_perform_authentication(data,pcVar18);
        break;
      }
      pbVar17 = (byte *)(pcVar13 + 2);
LAB_0013d393:
      do {
        uVar14 = (ulong)*pbVar17;
        if (uVar14 < 0x21) {
          if ((0x100002600U >> (uVar14 & 0x3f) & 1) != 0) {
            pbVar17 = pbVar17 + 1;
            goto LAB_0013d393;
          }
          if (uVar14 != 0) goto LAB_0013d3b4;
          bVar5 = false;
        }
        else {
LAB_0013d3b4:
          pcVar13 = (char *)0x0;
          while ((0x20 < (ulong)pbVar17[(long)pcVar13] ||
                 ((0x100002601U >> ((ulong)pbVar17[(long)pcVar13] & 0x3f) & 1) == 0))) {
            pcVar13 = pcVar13 + 1;
          }
          if (pcVar13 == (char *)0x7) {
            if (*(int *)(pbVar17 + 3) != 0x52492d4c || *(int *)pbVar17 != 0x4c534153)
            goto LAB_0013d45d;
            pbVar1 = (byte *)((long)&pcVar18->proto + 0xfb);
            *pbVar1 = *pbVar1 | 0x10;
            pcVar16 = (char *)0x7;
          }
          else if (pcVar13 == (char *)0xd) {
            if (*(long *)(pbVar17 + 5) != 0x44454c4241534944 ||
                *(long *)pbVar17 != 0x5349444e49474f4c) goto LAB_0013d45d;
            pbVar1 = (byte *)((long)&pcVar18->proto + 0xfb);
            *pbVar1 = *pbVar1 | 8;
            pcVar16 = (char *)0xd;
          }
          else if ((pcVar13 == (char *)0x8) && (*(long *)pbVar17 == 0x534c545452415453)) {
            pbVar1 = (byte *)((long)&pcVar18->proto + 0xfb);
            *pbVar1 = *pbVar1 | 4;
            pcVar16 = (char *)0x8;
          }
          else {
LAB_0013d45d:
            pcVar16 = pcVar13;
            if (((char *)0x5 < pcVar13) && (pbVar17[4] == 0x3d && *(int *)pbVar17 == 0x48545541)) {
              pbVar17 = pbVar17 + 5;
              pcVar16 = pcVar13 + -5;
              uVar8 = Curl_sasl_decode_mech((char *)pbVar17,(size_t)pcVar16,(size_t *)&local_70);
              if ((uVar8 != 0) && (local_70.bufr + 5 == pcVar13)) {
                puVar2 = (ushort *)((long)&pcVar18->proto + 0xb8);
                *puVar2 = *puVar2 | uVar8;
              }
            }
          }
          pbVar17 = pbVar17 + (long)pcVar16;
          bVar5 = true;
        }
      } while (bVar5);
      goto LAB_0013d664;
    case IMAP_STARTTLS:
      pcVar18 = data->conn;
      CVar9 = CURLE_WEIRD_SERVER_REPLY;
      if ((pcVar18->proto).ftpc.pp.overflow == 0) {
        if (local_74 == 1) {
          CVar9 = imap_perform_upgrade_tls(data,pcVar18);
        }
        else {
          if ((data->set).use_ssl == '\x01') goto LAB_0013d92e;
          pcVar13 = "STARTTLS denied";
LAB_0013d97c:
          Curl_failf(data,pcVar13);
          CVar9 = CURLE_USE_SSL_FAILED;
        }
      }
      break;
    default:
      goto switchD_0013d1fb_caseD_4;
    case IMAP_AUTHENTICATE:
      CVar9 = Curl_sasl_continue(local_48,data,local_74,(saslprogress *)&local_70);
      if (CVar9 == CURLE_OK) {
        if ((int)local_70.bufr == 0) {
          if (((*(byte *)((long)&conn->proto + 0xfb) & 8) != 0) ||
             (((conn->proto).imapc.preftype & 1) == 0)) {
            pcVar13 = "Authentication cancelled";
            goto LAB_0013d913;
          }
          CVar9 = imap_perform_login(data,conn);
        }
        else {
          CVar12 = CURLE_OK;
          CVar9 = CURLE_OK;
          if ((int)local_70.bufr == 2) goto LAB_0013d7f6;
        }
      }
      break;
    case IMAP_LOGIN:
      if (local_74 == 1) goto switchD_0013d1fb_caseD_4;
      Curl_failf(data,"Access denied. %c",(ulong)local_74);
LAB_0013d91a:
      CVar9 = CURLE_LOGIN_DENIED;
      break;
    case IMAP_LIST:
    case IMAP_SEARCH:
      pcVar13 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
      if (uVar6 == 1) goto switchD_0013d1fb_caseD_4;
      CVar9 = CURLE_QUOTE_ERROR;
      if (uVar6 == 0x2a) {
        CVar9 = Curl_client_write(data,1,pcVar13,(data->conn->proto).ftpc.pp.nfinal);
      }
      break;
    case IMAP_SELECT:
      pcVar18 = data->conn;
      pIVar3 = (data->req).p.imap;
      pcVar13 = Curl_dyn_ptr(&(pcVar18->proto).ftpc.pp.recvbuf);
      if (uVar6 == 1) {
        if (((pIVar3->uidvalidity == (char *)0x0) ||
            (pcVar13 = (pcVar18->proto).ftpc.server_os, pcVar13 == (char *)0x0)) ||
           (iVar10 = curl_strequal(pIVar3->uidvalidity,pcVar13), iVar10 != 0)) {
          pcVar13 = (*Curl_cstrdup)(pIVar3->mailbox);
          (pcVar18->proto).imapc.mailbox = pcVar13;
          if (pcVar13 == (char *)0x0) {
LAB_0013d8ec:
            CVar9 = CURLE_OUT_OF_MEMORY;
          }
          else if (pIVar3->custom == (char *)0x0) {
            if (pIVar3->query == (char *)0x0) {
              CVar9 = imap_perform_fetch(data);
            }
            else {
              CVar9 = imap_perform_search(data);
            }
          }
          else {
            CVar9 = imap_perform_list(data);
          }
        }
        else {
          Curl_failf(data,"Mailbox UIDVALIDITY has changed");
          CVar9 = CURLE_REMOTE_FILE_NOT_FOUND;
        }
      }
      else {
        if (uVar6 != 0x2a) {
          pcVar13 = "Select failed";
LAB_0013d913:
          Curl_failf(data,pcVar13);
          goto LAB_0013d91a;
        }
        iVar10 = curl_strnequal(pcVar13 + 2,"OK [UIDVALIDITY ",0x10);
        CVar12 = CURLE_OK;
        CVar9 = CURLE_OK;
        if (iVar10 != 0) {
          pcVar13 = pcVar13 + 0x12;
          sVar19 = 0;
          do {
            if (9 < (byte)(pcVar13[sVar19] - 0x30U)) goto LAB_0013d579;
            sVar19 = sVar19 + 1;
          } while (sVar19 != 0x14);
          sVar19 = 0x14;
LAB_0013d579:
          CVar9 = CVar12;
          if ((sVar19 != 0) && (pcVar13[sVar19] == ']')) {
            Curl_dyn_init(&local_70,0x14);
            CVar12 = Curl_dyn_addn(&local_70,pcVar13,sVar19);
            if (CVar12 != CURLE_OK) goto LAB_0013d8ec;
            (*Curl_cfree)((pcVar18->proto).ftpc.server_os);
            (pcVar18->proto).ftpc.server_os = (char *)0x0;
            pcVar13 = Curl_dyn_ptr(&local_70);
            (pcVar18->proto).ftpc.server_os = pcVar13;
          }
        }
      }
      break;
    case IMAP_FETCH:
      pcVar13 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
      local_70.bufr = (char *)0x0;
      if (uVar6 == 0x2a) {
        pvVar15 = memchr(pcVar13,0x7b,(data->conn->proto).ftpc.pp.nfinal);
        if ((((pvVar15 == (void *)0x0) ||
             (CVar11 = curlx_strtoofft((char *)((long)pvVar15 + 1),&local_38,10,
                                       (curl_off_t *)&local_70), CVar11 != CURL_OFFT_OK)) ||
            ((long)local_38 - (long)pvVar15 < 2)) || (*local_38 != '}')) {
          Curl_failf(data,"Failed to parse FETCH response.");
          CVar12 = CURLE_WEIRD_SERVER_REPLY;
        }
        else {
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
             ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
              (0 < pcVar4->log_level)))) {
            Curl_infof(data,"Found %ld bytes to download",local_70.bufr);
          }
          Curl_pgrsSetDownloadSize(data,(curl_off_t)local_70.bufr);
          s = local_50;
          pcVar13 = (char *)(conn->proto).ftpc.pp.overflow;
          if (pcVar13 == (char *)0x0) {
            CVar12 = CURLE_OK;
          }
          else {
            Curl_dyn_tail(local_50,(size_t)pcVar13);
            (conn->proto).ftpc.pp.nfinal = 0;
            if (local_70.bufr <= pcVar13) {
              pcVar13 = local_70.bufr;
            }
            if (local_70.bufr == (char *)0x0) {
              (data->conn->proto).imapc.state = IMAP_STOP;
              CVar12 = CURLE_OK;
LAB_0013d9d3:
              bVar5 = false;
            }
            else {
              pcVar16 = Curl_dyn_ptr(s);
              CVar12 = Curl_client_write(data,1,pcVar16,(size_t)pcVar13);
              if (CVar12 != CURLE_OK) goto LAB_0013d9d3;
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                 ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar4->log_level)))) {
                Curl_infof(data,"Written %zu bytes, %lu bytes are left for transfer",pcVar13);
              }
              pcVar16 = (char *)(conn->proto).ftpc.pp.overflow;
              sVar19 = (long)pcVar16 - (long)pcVar13;
              if (pcVar16 < pcVar13 || sVar19 == 0) {
                (conn->proto).ftpc.pp.overflow = 0;
                Curl_dyn_reset(local_50);
              }
              else {
                (conn->proto).ftpc.pp.overflow = sVar19;
                Curl_dyn_tail(local_50,sVar19);
              }
              bVar5 = true;
              CVar12 = CURLE_OK;
            }
            CVar9 = CVar12;
            if (!bVar5) break;
          }
          if ((char *)(data->req).bytecount != local_70.bufr) {
            (data->req).maxdownload = (curl_off_t)local_70.bufr;
            (data->state).select_bits = '\x01';
            iVar10 = 1;
            pcVar13 = local_70.bufr;
            goto LAB_0013d276;
          }
          Curl_xfer_setup_nop(data);
        }
      }
      else {
        Curl_pgrsSetDownloadSize(data,-1);
        CVar12 = CURLE_REMOTE_FILE_NOT_FOUND;
      }
LAB_0013d7f6:
      (data->conn->proto).imapc.state = IMAP_STOP;
      CVar9 = CVar12;
      break;
    case IMAP_FETCH_FINAL:
      CVar9 = CURLE_WEIRD_SERVER_REPLY;
      goto LAB_0013d64c;
    case IMAP_APPEND:
      CVar9 = CURLE_UPLOAD_FAILED;
      if (local_74 == 0x2b) {
        Curl_pgrsSetUploadSize(data,(data->state).infilesize);
        CVar12 = CURLE_OK;
        iVar10 = 2;
        pcVar13 = (char *)0xffffffffffffffff;
LAB_0013d276:
        Curl_xfer_setup1(data,iVar10,(curl_off_t)pcVar13,false);
        goto LAB_0013d7f6;
      }
      break;
    case IMAP_APPEND_FINAL:
      CVar9 = CURLE_UPLOAD_FAILED;
LAB_0013d64c:
      if (local_74 == 1) {
switchD_0013d1fb_caseD_4:
        (data->conn->proto).imapc.state = IMAP_STOP;
LAB_0013d664:
        CVar9 = CURLE_OK;
      }
    }
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
    _Var7 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var7) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode imap_statemachine(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;
  (void)data;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
  if(imapc->state == IMAP_UPGRADETLS)
    return imap_perform_upgrade_tls(data, conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(data, FIRSTSOCKET, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(data, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(data, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(data, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE:
      result = imap_state_auth_resp(data, conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(data, imapcode, imapc->state);
      break;

    case IMAP_LIST:
    case IMAP_SEARCH:
      result = imap_state_listsearch_resp(data, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(data, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(data, conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(data, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(data, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(data, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
    default:
      /* internal error */
      imap_state(data, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}